

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Channel.cpp
# Opt level: O0

void __thiscall Channel::~Channel(Channel *this)

{
  std::function<void_()>::~function((function<void_()> *)0x105b7f);
  std::function<void_()>::~function((function<void_()> *)0x105b8d);
  std::function<void_()>::~function((function<void_()> *)0x105b9b);
  std::function<void_()>::~function((function<void_()> *)0x105ba9);
  std::weak_ptr<HttpData>::~weak_ptr((weak_ptr<HttpData> *)0x105bb7);
  return;
}

Assistant:

Channel::~Channel(){
    // close(fd_);
}